

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManAreCubeCollectList(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot,Gia_StaAre_t *pSta)

{
  int iVar1;
  uint **ppuVar2;
  Gia_StaAre_t *p2;
  Gia_PtrAre_t GVar3;
  
  GVar3 = *pRoot;
  ppuVar2 = p->ppStas;
  p2 = (Gia_StaAre_t *)
       ((long)p->nSize * (ulong)((uint)GVar3 & 0xfffff) * 4 +
       *(long *)((long)ppuVar2 + (ulong)((uint)GVar3 >> 0x11 & 0x3ff8)));
  while ((Gia_StaAre_t *)*ppuVar2 != p2) {
    if (-1 < (int)p2->iPrev) {
      iVar1 = Gia_StaAreDisjoint(pSta,p2,p->nWords);
      if (iVar1 == 0) {
        Vec_IntPush((&p->vCubesA)[p->iStaCur < (int)((uint)GVar3 & 0x7fffffff)],
                    (uint)GVar3 & 0x7fffffff);
      }
    }
    GVar3 = p2->iNext;
    p2 = Gia_StaNext(p,p2);
    ppuVar2 = p->ppStas;
  }
  return (int)ppuVar2;
}

Assistant:

static inline int Gia_ManAreCubeCollectList( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot, Gia_StaAre_t * pSta )
{
    Gia_StaAre_t * pCube;
    int iCube;
    Gia_ManAreForEachCubeList2( p, *pRoot, pCube, iCube )
    {
        if ( Gia_StaIsUnused( pCube ) )
            continue;
        if ( Gia_StaAreDisjoint( pSta, pCube, p->nWords ) )
        {
/*
            int iVar;
            p->nDisjs++;
            iVar = Gia_StaAreDisjointVar( pSta, pCube, p->nWords );
            if ( iVar >= 0 )
            {
                p->nDisjs2++;
                if ( iCube > p->iStaCur )
                    p->nDisjs3++;
            }
*/
            continue;
        }
//        p->nCompares++;
//        p->nEquals += Gia_StaAreEqual( pSta, pCube, p->nWords );
        if ( iCube <= p->iStaCur )
            Vec_IntPush( p->vCubesA, iCube );
        else
            Vec_IntPush( p->vCubesB, iCube );
    }
    return 1;
}